

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_service_handler.c
# Opt level: O1

void csp_service_handler(csp_packet_t *packet)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  csp_timestamp_t in_RAX;
  csp_iface_t *pcVar5;
  csp_memread64_fnc_t p_Var6;
  size_t sVar7;
  int iVar8;
  undefined1 *puVar9;
  csp_memptr_t pvVar10;
  csp_const_memptr_t pvVar11;
  csp_timestamp_t local_28;
  
  local_28 = in_RAX;
  switch((packet->id).dport) {
  case '\0':
    if ((packet->field_5).data[0] != '\0') goto LAB_001091b3;
    iVar8 = -2;
    switch((packet->field_5).data[1]) {
    case '\x01':
      strncpy((char *)((packet->field_5).data + 0x34),csp_conf.revision,0x14);
      iVar8 = 0;
      (packet->field_5).data[0x47] = '\0';
      *(undefined8 *)((long)&packet->field_5 + 0x48) = 0x3220373220727041;
      (packet->field_5).data32[0x14] = 0x353230;
      (packet->field_5).data[0x53] = '\0';
      *(undefined8 *)((long)&packet->field_5 + 0x54) = 0x30343a31313a3030;
      (packet->field_5).data[0x5c] = '\0';
      strncpy((char *)((packet->field_5).data + 2),csp_conf.hostname,0x14);
      (packet->field_5).data[0x15] = '\0';
      strncpy((char *)((packet->field_5).data + 0x16),csp_conf.model,0x1e);
      (packet->field_5).data[0x33] = '\0';
      packet->length = 0x5d;
      break;
    case '\x02':
      pcVar5 = csp_iflist_get_by_name((char *)((packet->field_5).data + 4));
      iVar8 = (uint)(pcVar5 != (csp_iface_t *)0x0) * 2 + -2;
      packet->length = 0xf;
      break;
    case '\x03':
      pcVar5 = csp_iflist_get_by_name((char *)((packet->field_5).data + 2));
      if (pcVar5 == (csp_iface_t *)0x0) {
        iVar8 = -2;
      }
      else {
        uVar3 = pcVar5->tx;
        *(uint *)((long)&packet->field_5 + 0xd) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        uVar3 = pcVar5->rx;
        *(uint *)((long)&packet->field_5 + 0x11) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        uVar3 = pcVar5->tx_error;
        *(uint *)((long)&packet->field_5 + 0x15) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        uVar3 = pcVar5->rx_error;
        *(uint *)((long)&packet->field_5 + 0x19) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        uVar3 = pcVar5->drop;
        *(uint *)((long)&packet->field_5 + 0x1d) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        uVar3 = pcVar5->autherr;
        *(uint *)((long)&packet->field_5 + 0x21) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        uVar3 = pcVar5->frame;
        *(uint *)((long)&packet->field_5 + 0x25) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        uVar3 = pcVar5->txbytes;
        *(uint *)((long)&packet->field_5 + 0x29) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        uVar3 = pcVar5->rxbytes;
        *(uint *)((long)&packet->field_5 + 0x2d) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        uVar3 = pcVar5->irq;
        *(uint *)((long)&packet->field_5 + 0x31) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        iVar8 = 0;
      }
      packet->length = 0x35;
      break;
    case '\x04':
      uVar3 = *(uint *)((long)&packet->field_5 + 2);
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      *(uint *)((long)&packet->field_5 + 2) = uVar3;
      sVar7 = (size_t)(packet->field_5).data[6];
      if (sVar7 < 0xc9) {
        pvVar10 = (csp_memptr_t)((long)&packet->field_5 + 7);
        pvVar11 = (csp_const_memptr_t)(ulong)uVar3;
LAB_0010909c:
        (*csp_cmp_memcpy_fnc)(pvVar10,pvVar11,sVar7);
LAB_00109198:
        iVar8 = 0;
      }
      break;
    case '\x05':
      uVar3 = *(uint *)((long)&packet->field_5 + 2);
      uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      *(uint *)((long)&packet->field_5 + 2) = uVar3;
      sVar7 = (size_t)(packet->field_5).data[6];
      if (sVar7 < 0xc9) {
        pvVar10 = (csp_memptr_t)(ulong)uVar3;
        pvVar11 = (csp_const_memptr_t)((long)&packet->field_5 + 7);
        goto LAB_0010909c;
      }
      break;
    case '\x06':
      uVar3 = *(uint *)((long)&packet->field_5 + 2);
      uVar1 = *(uint *)((long)&packet->field_5 + 6);
      local_28.tv_nsec =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      local_28.tv_sec =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      iVar8 = 0;
      if ((uVar3 != 0) && (iVar4 = csp_clock_set_time(&local_28), iVar4 != 0)) {
        csp_dbg_errno = '\f';
        iVar8 = iVar4;
      }
      csp_clock_get_time(&local_28);
      *(uint32_t *)((long)&packet->field_5 + 2) =
           local_28.tv_sec >> 0x18 | (local_28.tv_sec & 0xff0000) >> 8 |
           (local_28.tv_sec & 0xff00) << 8 | local_28.tv_sec << 0x18;
      *(uint32_t *)((long)&packet->field_5 + 6) =
           local_28.tv_nsec >> 0x18 | (local_28.tv_nsec & 0xff0000) >> 8 |
           (local_28.tv_nsec & 0xff00) << 8 | local_28.tv_nsec << 0x18;
      break;
    case '\a':
      pcVar5 = csp_iflist_get_by_name((char *)((packet->field_5).data + 8));
      iVar8 = (uint)(pcVar5 != (csp_iface_t *)0x0) * 2 + -2;
      packet->length = 0x14;
      break;
    case '\b':
      uVar2 = *(ulong *)((long)&packet->field_5 + 2);
      puVar9 = (undefined1 *)
               (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
               uVar2 << 0x38);
      *(undefined1 **)((long)&packet->field_5 + 2) = puVar9;
      sVar7 = (size_t)(packet->field_5).data[10];
      if ((sVar7 < 0xc5) && (csp_cmp_memread64_fnc != (csp_memread64_fnc_t)0x0)) {
        pvVar11 = (csp_const_memptr_t)((long)&packet->field_5 + 0xb);
        p_Var6 = csp_cmp_memread64_fnc;
LAB_00109196:
        (*p_Var6)(pvVar11,(csp_memptr64_t)puVar9,sVar7);
        goto LAB_00109198;
      }
      break;
    case '\t':
      uVar2 = *(ulong *)((long)&packet->field_5 + 2);
      pvVar11 = (csp_const_memptr_t)
                (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                 (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                 (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38);
      *(csp_const_memptr_t *)((long)&packet->field_5 + 2) = pvVar11;
      sVar7 = (size_t)(packet->field_5).data[10];
      if ((sVar7 < 0xc5) && (csp_cmp_memwrite64_fnc != (csp_memwrite64_fnc_t)0x0)) {
        puVar9 = (undefined1 *)((long)&packet->field_5 + 0xb);
        p_Var6 = (csp_memread64_fnc_t)csp_cmp_memwrite64_fnc;
        goto LAB_00109196;
      }
    }
    (packet->field_5).data[0] = 0xff;
    if (iVar8 != 0) {
LAB_001091b3:
      csp_buffer_free(packet);
      return;
    }
  case '\x01':
    goto switchD_00108ea2_caseD_1;
  case '\x02':
    uVar3 = csp_ps_hook(packet);
    packet->length = (uint16_t)uVar3;
    if ((uint16_t)uVar3 == 0) {
      csp_buffer_free(packet);
    }
    goto switchD_00108ea2_caseD_1;
  case '\x03':
    uVar3 = csp_memfree_hook();
    break;
  case '\x04':
    uVar3 = (packet->field_5).data32[0];
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    if (uVar3 == 0xd1e5529a) {
      csp_shutdown_hook();
    }
    else if (uVar3 == 0x80078007) {
      csp_reboot_hook();
    }
  default:
    csp_buffer_free(packet);
    return;
  case '\x05':
    uVar3 = csp_buffer_remaining();
    break;
  case '\x06':
    uVar3 = csp_get_s();
  }
  (packet->field_5).data32[0] =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  packet->length = 4;
switchD_00108ea2_caseD_1:
  if (packet != (csp_packet_t *)0x0) {
    csp_sendto_reply(packet,packet,0x8000);
  }
  return;
}

Assistant:

void csp_service_handler(csp_packet_t * packet) {

	switch (packet->id.dport) {

		case CSP_CMP:
			/* Pass to CMP handler */
			if (csp_cmp_handler(packet) != CSP_ERR_NONE) {
				csp_buffer_free(packet);
				return;
			}
			break;

		case CSP_PING:
			/* A ping means, just echo the packet, so no changes */
			break;

		case CSP_PS: {
			packet->length = csp_ps_hook(packet);
			if (packet->length == 0) {
				csp_buffer_free(packet);
			}
			break;
		}

		case CSP_MEMFREE: {

			uint32_t total = 0;
			total = csp_memfree_hook();
			
			total = htobe32(total);
			memcpy(packet->data, &total, sizeof(total));
			packet->length = sizeof(total);

			break;
		}

		case CSP_REBOOT: {
			uint32_t magic_word;
			memcpy(&magic_word, packet->data, sizeof(magic_word));

			magic_word = be32toh(magic_word);

			/* If the magic word is valid, reboot */
			if (magic_word == CSP_REBOOT_MAGIC) {
				csp_reboot_hook();
			} else if (magic_word == CSP_REBOOT_SHUTDOWN_MAGIC) {
				csp_shutdown_hook();
			}

			csp_buffer_free(packet);
			return;
		}

		case CSP_BUF_FREE: {
			uint32_t size = csp_buffer_remaining();
			size = htobe32(size);
			memcpy(packet->data, &size, sizeof(size));
			packet->length = sizeof(size);
			break;
		}

		case CSP_UPTIME: {
			uint32_t time = csp_get_s();
			time = htobe32(time);
			memcpy(packet->data, &time, sizeof(time));
			packet->length = sizeof(time);
			break;
		}

		default:
			csp_buffer_free(packet);
			return;
	}

	if (packet != NULL) {
		csp_sendto_reply(packet, packet, CSP_O_SAME);
	}
}